

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_unpack_external_
               (char *datarep,void *inbuf,MPIABI_Fint *insize,MPIABI_Fint *position,void *outbuf,
               MPIABI_Fint *outcount,MPIABI_Fint *datatype,MPIABI_Fint *ierror,size_t datarep_len)

{
  mpi_unpack_external_();
  return;
}

Assistant:

void mpiabi_unpack_external_(
  const char * datarep,
  const void * inbuf,
  const MPIABI_Fint * insize,
  MPIABI_Fint * position,
  void * outbuf,
  const MPIABI_Fint * outcount,
  const MPIABI_Fint * datatype,
  MPIABI_Fint * ierror,
  size_t datarep_len
) {
  return mpi_unpack_external_(
    datarep,
    inbuf,
    insize,
    position,
    outbuf,
    outcount,
    datatype,
    ierror,
    datarep_len
  );
}